

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O0

void __thiscall CLineInput::SetBuffer(CLineInput *this,char *pStr,int MaxSize,int MaxChars)

{
  long lVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *pLastStr;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar2;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(in_RDI + 0x68) == 0) || (*(long *)(in_RDI + 0x68) != in_RSI)) {
    lVar1 = *(long *)(in_RDI + 0x68);
    *(long *)(in_RDI + 0x68) = in_RSI;
    *(undefined4 *)(in_RDI + 0x70) = in_EDX;
    *(undefined4 *)(in_RDI + 0x74) = in_ECX;
    bVar2 = 0;
    if ((*(long *)(in_RDI + 0x68) != 0) && (bVar2 = 0, lVar1 != 0)) {
      bVar2 = *(byte *)(in_RDI + 0x99);
    }
    *(byte *)(in_RDI + 0x99) = bVar2 & 1;
    if (lVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x8c) = 0;
      vector2_base<float>::vector2_base(&local_10,0.0,0.0);
      *(vector2_base<float> *)(in_RDI + 0x90) = local_10;
    }
    if ((*(long *)(in_RDI + 0x68) != 0) && (*(long *)(in_RDI + 0x68) != lVar1)) {
      UpdateStrData((CLineInput *)CONCAT17(bVar2,in_stack_ffffffffffffffc0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CLineInput::SetBuffer(char *pStr, int MaxSize, int MaxChars)
{
	if(m_pStr && m_pStr == pStr)
		return;
	const char *pLastStr = m_pStr;
	m_pStr = pStr;
	m_MaxSize = MaxSize;
	m_MaxChars = MaxChars;
	m_WasChanged = m_pStr && pLastStr && m_WasChanged;
	if(!pLastStr)
	{
		m_ScrollOffset = 0;
		m_CaretPosition = vec2(0, 0);
	}
	if(m_pStr && m_pStr != pLastStr)
		UpdateStrData();
}